

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.h
# Opt level: O0

bool __thiscall spvtools::utils::BitVector::Get(BitVector *this,uint32_t i)

{
  size_type sVar1;
  const_reference pvVar2;
  uint32_t bit_in_element;
  uint32_t element_index;
  uint32_t i_local;
  BitVector *this_local;
  
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->bits_);
  if (i >> 6 < sVar1) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->bits_,(ulong)(i >> 6));
    this_local._7_1_ = (*pvVar2 & 1L << ((byte)i & 0x3f)) != 0;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Get(uint32_t i) const {
    uint32_t element_index = i / kBitContainerSize;
    uint32_t bit_in_element = i % kBitContainerSize;

    if (element_index >= bits_.size()) {
      return false;
    }

    return (bits_[element_index] &
            (static_cast<BitContainer>(1) << bit_in_element)) != 0;
  }